

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Man_t * Gia_ManFraigSweepSimple(Gia_Man_t *p,void *pPars)

{
  int iVar1;
  Gia_Man_t *local_20;
  Gia_Man_t *pNew;
  void *pPars_local;
  Gia_Man_t *p_local;
  
  if (p->pManTime != (void *)0x0) {
    iVar1 = Gia_ManBoxNum(p);
    if (iVar1 != 0) {
      __assert_fail("p->pManTime == NULL || Gia_ManBoxNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                    ,0x248,"Gia_Man_t *Gia_ManFraigSweepSimple(Gia_Man_t *, void *)");
    }
  }
  Gia_ManFraigSweepPerform(p,pPars);
  local_20 = Gia_ManEquivReduce(p,1,0,0,0);
  if (local_20 == (Gia_Man_t *)0x0) {
    local_20 = Gia_ManDup(p);
  }
  Gia_ManTransferTiming(local_20,p);
  return local_20;
}

Assistant:

Gia_Man_t * Gia_ManFraigSweepSimple( Gia_Man_t * p, void * pPars )
{
    Gia_Man_t * pNew;
    assert( p->pManTime == NULL || Gia_ManBoxNum(p) == 0 );
    Gia_ManFraigSweepPerform( p, pPars );
    pNew = Gia_ManEquivReduce( p, 1, 0, 0, 0 );
    if ( pNew == NULL )
        pNew = Gia_ManDup(p);
    Gia_ManTransferTiming( pNew, p );
    return pNew;
}